

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

void use_crystal_ball(obj *obj)

{
  undefined8 uVar1;
  schar sVar2;
  boolean bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  char ch;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  
  if (((u.uprops[0x1e].intrinsic != 0) ||
      (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
     ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
    pcVar7 = xname(obj);
    pcVar7 = the(pcVar7);
    pcVar10 = "Too bad you can\'t see %s.";
LAB_001615b5:
    pline(pcVar10,pcVar7);
    return;
  }
  uVar9 = 0xd;
  if ((obj->field_0x4a & 2) == 0) {
    uVar9 = 0x14;
  }
  uVar5 = mt_random();
  sVar2 = acurr(1);
  if ((((int)sVar2 <= (int)(uVar5 % uVar9)) || ((obj->field_0x4a & 1) != 0)) && ('\0' < obj->spe)) {
    uVar9 = 4;
    if ((obj->oartifact == '\0') && ((obj->field_0x4a & 2) == 0)) {
      sVar2 = acurr(1);
      uVar9 = '\x11' < sVar2 ^ 5;
    }
    uVar5 = mt_random();
    (*(code *)(&DAT_002a12d4 + *(int *)(&DAT_002a12d4 + ((ulong)uVar5 % (ulong)uVar9) * 4)))();
    return;
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    if (flags.verbose != '\0') {
      pline("You may look for an object or monster symbol.");
    }
    cVar4 = query_key("What do you look for?",(int *)0x0);
    if ((cVar4 == ' ') || (pcVar7 = strchr(" \r\n\x1b",(int)cVar4), pcVar7 == (char *)0x0)) {
      pcVar7 = xname(obj);
      pcVar7 = the(pcVar7);
      pline("You peer into %s...",pcVar7);
      bVar11 = u.uprops[0x38].extrinsic == 0;
      uVar9 = mt_random();
      nomul(~(uVar9 % ((uint)bVar11 * 8 + 2)),"gazing into a crystal ball");
      nomovemsg = "";
      if ('\0' < obj->spe) {
        discover_object(0xec,'\x01','\x01');
        consume_obj_charge(obj,'\x01');
        ch = 'm';
        if (cVar4 != ']') {
          ch = cVar4;
        }
        iVar6 = def_char_to_objclass(ch);
        if (iVar6 == 0x12) {
          iVar6 = def_char_to_monclass(ch);
          if (iVar6 == 0x3d) {
            if (ch == '^') {
              iVar6 = trap_detect((obj *)0x0);
            }
            else {
              uVar9 = mt_random();
              uVar8 = (ulong)((uVar9 & 3) << 4);
              uVar1 = *(undefined8 *)((long)&level_detects[0].what + uVar8);
              pcVar7 = level_distance(*(d_level **)((long)&level_detects[0].where + uVar8));
              iVar6 = 0;
              pline("You see %s, %s.",uVar1,pcVar7);
            }
          }
          else {
            iVar6 = monster_detect((obj *)0x0,iVar6);
          }
        }
        else {
          iVar6 = object_detect((obj *)0x0,iVar6,'\0');
        }
        if (iVar6 == 0) {
          return;
        }
        uVar9 = mt_random();
        if ((uVar9 * -0x3d70a3d7 >> 2 | uVar9 * 0x40000000) < 0x28f5c29) {
          pcVar7 = "You see the Wizard of Yendor gazing out at you.";
          goto LAB_001619f3;
        }
      }
      pcVar7 = "The vision is unclear.";
    }
    else {
      if (flags.verbose == '\0') {
        return;
      }
      pcVar7 = "Never mind.";
    }
LAB_001619f3:
    pline(pcVar7);
    return;
  }
  if (obj->spe == '\0') {
    pcVar7 = hcolor((char *)0x0);
    pcVar10 = "All you see is funky %s haze.";
    goto LAB_001615b5;
  }
  uVar9 = mt_random();
  switch(uVar9 % 6) {
  case 0:
    pcVar7 = "You grok some groovy globs of incandescent lava.";
    break;
  case 1:
    iVar6 = poly_gender();
    pcVar7 = "dude";
    if (iVar6 == 1) {
      pcVar7 = "babe";
    }
    pcVar10 = "Whoa!  Psychedelic colors, %s!";
    goto LAB_00161ad8;
  case 2:
    pcVar7 = hcolor((char *)0x0);
    pcVar10 = "The crystal pulses with sinister %s light!";
LAB_00161ad8:
    pline(pcVar10,pcVar7);
    goto LAB_00161aef;
  case 3:
    pcVar7 = "You see goldfish swimming above fluorescent rocks.";
    break;
  case 4:
    pcVar7 = "You see tiny snowflakes spinning around a miniature farmhouse.";
    break;
  default:
    pcVar7 = "Oh wow... like a kaleidoscope!";
  }
  pline(pcVar7);
LAB_00161aef:
  consume_obj_charge(obj,'\x01');
  return;
}

Assistant:

void use_crystal_ball(struct obj *obj)
{
    char ch;
    int oops;

    if (Blind) {
	pline("Too bad you can't see %s.", the(xname(obj)));
	return;
    }
    oops = (rnd(obj->blessed ? 13 : 20) > ACURR(A_INT) || obj->cursed);
    if (oops && (obj->spe > 0)) {
	switch (rnd((obj->oartifact || obj->blessed || ACURR(A_INT) >= 18) ? 4 : 5)) {
	case 1 : pline("%s too much to comprehend!", Tobjnam(obj, "are"));
	    break;
	case 2 : pline("%s you!", Tobjnam(obj, "confuse"));
	    make_confused(HConfusion + rnd(100),FALSE);
	    break;
	case 3 : if (!resists_blnd(&youmonst)) {
		pline("%s your vision!", Tobjnam(obj, "damage"));
		make_blinded(Blinded + rnd(100),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    } else {
		pline("%s your vision.", Tobjnam(obj, "assault"));
		pline("You are unaffected!");
	    }
	    break;
	case 4 : pline("%s your mind!", Tobjnam(obj, "zap"));
	    make_hallucinated(HHallucination + rnd(100),FALSE,0L);
	    break;
	case 5 : pline("%s!", Tobjnam(obj, "explode"));
	    useup(obj);
	    obj = 0;	/* it's gone */
	    losehp(rnd(30), "exploding crystal ball", KILLED_BY_AN);
	    break;
	}
	if (obj) consume_obj_charge(obj, TRUE);
	return;
    }

    if (Hallucination) {
	if (!obj->spe) {
	    pline("All you see is funky %s haze.", hcolor(NULL));
	} else {
	    switch(rnd(6)) {
	    case 1 : pline("You grok some groovy globs of incandescent lava.");
		break;
	    case 2 : pline("Whoa!  Psychedelic colors, %s!",
			   poly_gender() == 1 ? "babe" : "dude");
		break;
	    case 3 : pline("The crystal pulses with sinister %s light!",
				hcolor(NULL));
		break;
	    case 4 : pline("You see goldfish swimming above fluorescent rocks.");
		break;
	    case 5 : pline("You see tiny snowflakes spinning around a miniature farmhouse.");
		break;
	    default: pline("Oh wow... like a kaleidoscope!");
		break;
	    }
	    consume_obj_charge(obj, TRUE);
	}
	return;
    }

    /* read a single character */
    if (flags.verbose) pline("You may look for an object or monster symbol.");
    ch = query_key("What do you look for?", NULL);
    /* Don't filter out ' ' here; it has a use */
    if ((ch != def_monsyms[S_GHOST]) && strchr(quitchars,ch)) { 
	if (flags.verbose) pline("Never mind.");
	return;
    }
    pline("You peer into %s...", the(xname(obj)));
    nomul(-rnd(Free_action ? 2 : 10), "gazing into a crystal ball");
    nomovemsg = "";
    if (obj->spe <= 0)
	pline("The vision is unclear.");
    else {
	int class;
	int ret = 0;

	makeknown(CRYSTAL_BALL);
	consume_obj_charge(obj, TRUE);

	/* special case: accept ']' as synonym for mimic
	 * we have to do this before the def_char_to_objclass check
	 */
	if (ch == DEF_MIMIC_DEF) ch = DEF_MIMIC;

	if ((class = def_char_to_objclass(ch)) != MAXOCLASSES)
		ret = object_detect(NULL, class, FALSE);
	else if ((class = def_char_to_monclass(ch)) != MAXMCLASSES)
		ret = monster_detect(NULL, class);
	else switch(ch) {
		case '^':
		    ret = trap_detect(NULL);
		    break;
		default:
		    {
		    int i = rn2(SIZE(level_detects));
		    pline("You see %s, %s.",
			level_detects[i].what,
			level_distance(level_detects[i].where));
		    }
		    ret = 0;
		    break;
	}

	if (ret) {
	    if (!rn2(100))  /* make them nervous */
		pline("You see the Wizard of Yendor gazing out at you.");
	    else pline("The vision is unclear.");
	}
    }
    return;
}